

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmaturePopulate.cpp
# Opt level: O3

void Assimp::ArmaturePopulate::BuildBoneList
               (aiNode *current_node,aiNode *root_node,aiScene *scene,
               vector<aiBone_*,_std::allocator<aiBone_*>_> *bones)

{
  pointer *pppaVar1;
  aiNode *current_node_00;
  aiMesh *paVar2;
  iterator __position;
  __normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_> _Var3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  aiBone *bone;
  aiBone *local_50;
  aiNode *local_48;
  aiNode *local_40;
  ulong local_38;
  
  local_40 = root_node;
  if (scene == (aiScene *)0x0) {
    __assert_fail("scene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                  ,0x70,
                  "static void Assimp::ArmaturePopulate::BuildBoneList(aiNode *, const aiNode *, const aiScene *, std::vector<aiBone *> &)"
                 );
  }
  if (current_node->mNumChildren != 0) {
    local_38 = 0;
    local_48 = current_node;
    do {
      current_node_00 = local_48->mChildren[local_38];
      if (current_node_00 == (aiNode *)0x0) {
        __assert_fail("child",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                      ,0x73,
                      "static void Assimp::ArmaturePopulate::BuildBoneList(aiNode *, const aiNode *, const aiScene *, std::vector<aiBone *> &)"
                     );
      }
      uVar4 = current_node_00->mNumMeshes;
      if (uVar4 != 0) {
        uVar6 = 0;
        do {
          if (current_node_00->mMeshes == (uint *)0x0) {
            __assert_fail("child->mMeshes",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                          ,0x77,
                          "static void Assimp::ArmaturePopulate::BuildBoneList(aiNode *, const aiNode *, const aiScene *, std::vector<aiBone *> &)"
                         );
          }
          paVar2 = scene->mMeshes[current_node_00->mMeshes[uVar6]];
          if (paVar2 == (aiMesh *)0x0) {
            __assert_fail("mesh",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                          ,0x7a,
                          "static void Assimp::ArmaturePopulate::BuildBoneList(aiNode *, const aiNode *, const aiScene *, std::vector<aiBone *> &)"
                         );
          }
          if (paVar2->mNumBones != 0) {
            uVar7 = 0;
            do {
              local_50 = paVar2->mBones[uVar7];
              if (local_50 == (aiBone *)0x0) {
                __assert_fail("bone",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                              ,0x7e,
                              "static void Assimp::ArmaturePopulate::BuildBoneList(aiNode *, const aiNode *, const aiScene *, std::vector<aiBone *> &)"
                             );
              }
              _Var3 = std::
                      __find_if<__gnu_cxx::__normal_iterator<aiBone**,std::vector<aiBone*,std::allocator<aiBone*>>>,__gnu_cxx::__ops::_Iter_equals_val<aiBone*const>>
                                ((bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>).
                                 _M_impl.super__Vector_impl_data._M_finish,&local_50);
              __position._M_current =
                   (bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (_Var3._M_current == __position._M_current) {
                if (_Var3._M_current ==
                    (bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiBone*,std::allocator<aiBone*>>::_M_realloc_insert<aiBone*const&>
                            ((vector<aiBone*,std::allocator<aiBone*>> *)bones,__position,&local_50);
                }
                else {
                  *__position._M_current = local_50;
                  pppaVar1 = &(bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish;
                  *pppaVar1 = *pppaVar1 + 1;
                }
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 < paVar2->mNumBones);
            uVar4 = current_node_00->mNumMeshes;
          }
          uVar5 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar5;
        } while (uVar5 < uVar4);
      }
      BuildBoneList(current_node_00,local_40,scene,bones);
      uVar4 = (int)local_38 + 1;
      local_38 = (ulong)uVar4;
    } while (uVar4 < local_48->mNumChildren);
  }
  return;
}

Assistant:

void ArmaturePopulate::BuildBoneList(aiNode *current_node,
                                     const aiNode *root_node,
                                     const aiScene *scene,
                                     std::vector<aiBone *> &bones) {
  ai_assert(scene);
  for (unsigned int nodeId = 0; nodeId < current_node->mNumChildren; ++nodeId) {
    aiNode *child = current_node->mChildren[nodeId];
    ai_assert(child);

    // check for bones
    for (unsigned int meshId = 0; meshId < child->mNumMeshes; ++meshId) {
      ai_assert(child->mMeshes);
      unsigned int mesh_index = child->mMeshes[meshId];
      aiMesh *mesh = scene->mMeshes[mesh_index];
      ai_assert(mesh);

      for (unsigned int boneId = 0; boneId < mesh->mNumBones; ++boneId) {
        aiBone *bone = mesh->mBones[boneId];
        ai_assert(bone);

        // duplicate meshes exist with the same bones sometimes :)
        // so this must be detected
        if (std::find(bones.begin(), bones.end(), bone) == bones.end()) {
          // add the element once
          bones.push_back(bone);
        }
      }

      // find mesh and get bones
      // then do recursive lookup for bones in root node hierarchy
    }

    BuildBoneList(child, root_node, scene, bones);
  }
}